

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

bool __thiscall QPDF::isLinearized(QPDF *this)

{
  long *plVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  token_type_e tVar4;
  char cVar5;
  int iVar6;
  unsigned_long i;
  longlong lVar7;
  long lVar8;
  byte unaff_BPL;
  bool bVar9;
  double dVar10;
  QPDFObjectHandle candidate;
  string buffer;
  QPDFObjectHandle L;
  QPDFObjectHandle linkey;
  Token t1;
  long *local_200 [2];
  long local_1f0 [2];
  string local_1e0;
  long local_1c0 [2];
  QPDFObjectHandle local_1b0;
  QPDFObjectHandle local_1a0;
  double local_190;
  long *local_188;
  size_t local_180;
  long local_178 [2];
  Token local_168;
  Token local_100;
  Token local_98;
  
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  local_1e0.field_2._M_allocated_capacity = (size_type)local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0.field_2,'\0');
  (**(code **)(*plVar1 + 0x28))(plVar1,0,0);
  std::__cxx11::string::resize((ulong)&local_1e0.field_2,'\0');
  cVar5 = (**(code **)(*plVar1 + 0x38))(plVar1,local_1e0.field_2._M_allocated_capacity,0x400);
  std::__cxx11::string::resize((ulong)&local_1e0.field_2,cVar5);
  i = 0;
  do {
    i = std::__cxx11::string::find_first_of(local_1e0.field_2._M_local_buf,0x28127e,i);
    if (i == 0xffffffffffffffff) {
      unaff_BPL = false;
      break;
    }
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    if ((long)i < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
    }
    (**(code **)(*plVar1 + 0x28))(plVar1,i,0);
    readToken(&local_100,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x14);
    tVar4 = local_100.type;
    bVar9 = true;
    if ((local_100.type == tt_integer) &&
       (readToken(&local_98,this,
                  (((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6),
       local_98.type == tt_integer)) {
      readToken(&local_168,this,
                (((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"obj","");
      bVar3 = true;
      if ((local_168.type == tt_word) && (local_168.value._M_string_length == local_180)) {
        if (local_168.value._M_string_length == 0) {
          bVar9 = false;
        }
        else {
          iVar6 = bcmp(local_168.value._M_dataplus._M_p,local_188,local_168.value._M_string_length);
          bVar9 = iVar6 != 0;
        }
      }
      else {
        bVar9 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.error_message._M_dataplus._M_p != &local_168.error_message.field_2) {
        operator_delete(local_168.error_message._M_dataplus._M_p,
                        local_168.error_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.raw_value._M_dataplus._M_p != &local_168.raw_value.field_2) {
        operator_delete(local_168.raw_value._M_dataplus._M_p,
                        local_168.raw_value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.value._M_dataplus._M_p != &local_168.value.field_2) {
        operator_delete(local_168.value._M_dataplus._M_p,
                        local_168.value.field_2._M_allocated_capacity + 1);
      }
    }
    if (tVar4 == tt_integer) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.error_message._M_dataplus._M_p != &local_98.error_message.field_2) {
        operator_delete(local_98.error_message._M_dataplus._M_p,
                        local_98.error_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.raw_value._M_dataplus._M_p != &local_98.raw_value.field_2) {
        operator_delete(local_98.raw_value._M_dataplus._M_p,
                        local_98.raw_value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.value._M_dataplus._M_p != &local_98.value.field_2) {
        operator_delete(local_98.value._M_dataplus._M_p,
                        local_98.value.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar9) {
      i = std::__cxx11::string::find_first_not_of(local_1e0.field_2._M_local_buf,0x28127e,i);
      bVar9 = i != 0xffffffffffffffff;
      unaff_BPL = unaff_BPL & bVar9;
    }
    else {
      lVar7 = QUtil::string_to_ll(local_100.value._M_dataplus._M_p);
      if ((int)lVar7 != lVar7) {
        QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar7);
      }
      getObject((QPDF *)&local_1e0,(int)this,(int)lVar7);
      bVar9 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_1e0);
      if (bVar9) {
        local_200[0] = local_1f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"/Linearized","");
        QPDFObjectHandle::getKey(&local_1a0,&local_1e0);
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        bVar9 = QPDFObjectHandle::isNumber(&local_1a0);
        if (bVar9) {
          dVar10 = QPDFObjectHandle::getNumericValue(&local_1a0);
          dVar10 = floor(dVar10);
          if ((dVar10 < -2147483648.0) || (2147483647.0 < dVar10)) {
            local_190 = dVar10;
            QIntC::IntConverter<double,_int,_true,_true>::error(dVar10);
            dVar10 = local_190;
          }
          if ((int)dVar10 != 1) goto LAB_0021694f;
          local_200[0] = local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"/L","");
          QPDFObjectHandle::getKey(&local_1b0,&local_1e0);
          if (local_200[0] != local_1f0) {
            operator_delete(local_200[0],local_1f0[0] + 1);
          }
          bVar9 = QPDFObjectHandle::isInteger(&local_1b0);
          if (bVar9) {
            lVar7 = QPDFObjectHandle::getIntValue(&local_1b0);
            plVar1 = *(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
            (**(code **)(*plVar1 + 0x28))(plVar1,0,2);
            lVar8 = (**(code **)(**(long **)&(((this->m)._M_t.
                                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                              _M_head_impl)->file).
                                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                + 0x20))();
            if (lVar7 != lVar8) goto LAB_002169ec;
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            ((_Var2._M_head_impl)->linp).file_size = lVar7;
            *(pointer *)&((_Var2._M_head_impl)->lindict).super_BaseHandle =
                 local_1e0._M_dataplus._M_p;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(_Var2._M_head_impl)->lindict + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0._M_string_length);
            unaff_BPL = true;
          }
          else {
LAB_002169ec:
            unaff_BPL = false;
          }
          if (local_1b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        else {
LAB_0021694f:
          unaff_BPL = false;
        }
        if (local_1a0.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      else {
        unaff_BPL = false;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._M_string_length);
      }
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.error_message._M_dataplus._M_p != &local_100.error_message.field_2) {
      operator_delete(local_100.error_message._M_dataplus._M_p,
                      local_100.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.raw_value._M_dataplus._M_p != &local_100.raw_value.field_2) {
      operator_delete(local_100.raw_value._M_dataplus._M_p,
                      local_100.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.value._M_dataplus._M_p != &local_100.value.field_2) {
      operator_delete(local_100.value._M_dataplus._M_p,
                      local_100.value.field_2._M_allocated_capacity + 1);
    }
  } while (bVar9);
  if ((long *)local_1e0.field_2._M_allocated_capacity != local_1c0) {
    operator_delete((void *)local_1e0.field_2._M_allocated_capacity,local_1c0[0] + 1);
  }
  return (bool)unaff_BPL;
}

Assistant:

bool
QPDF::isLinearized()
{
    // If the first object in the file is a dictionary with a suitable /Linearized key and has an /L
    // key that accurately indicates the file size, initialize m->lindict and return true.

    // A linearized PDF spec's first object will be contained within the first 1024 bytes of the
    // file and will be a dictionary with a valid /Linearized key.  This routine looks for that and
    // does no additional validation.

    // The PDF spec says the linearization dictionary must be completely contained within the first
    // 1024 bytes of the file. Add a byte for a null terminator.
    auto buffer = m->file->read(1024, 0);
    size_t pos = 0;
    while (true) {
        // Find a digit or end of buffer
        pos = buffer.find_first_of("0123456789"sv, pos);
        if (pos == std::string::npos) {
            return false;
        }
        // Seek to the digit. Then skip over digits for a potential
        // next iteration.
        m->file->seek(toO(pos), SEEK_SET);

        auto t1 = readToken(*m->file, 20);
        if (!(t1.isInteger() && readToken(*m->file, 6).isInteger() &&
              readToken(*m->file, 4).isWord("obj"))) {
            pos = buffer.find_first_not_of("0123456789"sv, pos);
            if (pos == std::string::npos) {
                return false;
            }
            continue;
        }

        auto candidate = getObject(toI(QUtil::string_to_ll(t1.getValue().data())), 0);
        if (!candidate.isDictionary()) {
            return false;
        }

        auto linkey = candidate.getKey("/Linearized");
        if (!(linkey.isNumber() && toI(floor(linkey.getNumericValue())) == 1)) {
            return false;
        }

        auto L = candidate.getKey("/L");
        if (!L.isInteger()) {
            return false;
        }
        qpdf_offset_t Li = L.getIntValue();
        m->file->seek(0, SEEK_END);
        if (Li != m->file->tell()) {
            QTC::TC("qpdf", "QPDF /L mismatch");
            return false;
        }
        m->linp.file_size = Li;
        m->lindict = candidate;
        return true;
    }
}